

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.hpp
# Opt level: O2

string_view __thiscall
cinatra::get_local_time_str<8ul,32ul>(cinatra *this,char (*buf) [32],time_t t,string_view format)

{
  char cVar1;
  undefined2 *puVar2;
  cinatra c;
  tm *ptVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  int i;
  int num;
  cinatra *p;
  string_view sVar7;
  char (*local_38) [32];
  
  sVar4 = format._M_len;
  local_38 = buf;
  ptVar3 = gmtime((time_t *)&local_38);
  iVar5 = 0;
  p = this;
  do {
    uVar6 = (ulong)iVar5;
    if ((ulong)t <= uVar6) {
      sVar7._M_str = (char *)this;
      sVar7._M_len = (size_t)(p + ~(ulong)this);
      return sVar7;
    }
    if (*(char *)(sVar4 + uVar6) != '%') goto LAB_00232fdf;
    c = (cinatra)0x30;
    if (uVar6 + 2 < (ulong)t) {
      c = *(cinatra *)(sVar4 + uVar6 + 2);
    }
    cVar1 = *(char *)(sVar4 + 1 + uVar6);
    iVar5 = iVar5 + 1;
    if (cVar1 == 'H') {
      num = ptVar3->tm_hour + 8;
LAB_00232fd3:
      to_int<2ul>(num,(char)c,(char *)p);
      p = p + 3;
    }
    else {
      if (cVar1 == 'M') {
        num = ptVar3->tm_min;
        goto LAB_00232fd3;
      }
      if (cVar1 == 'S') {
        num = ptVar3->tm_sec;
        goto LAB_00232fd3;
      }
      if (cVar1 == 'm') {
        num = ptVar3->tm_mon + 1;
        goto LAB_00232fd3;
      }
      if (cVar1 == 'a') {
        puVar2 = *(undefined2 **)(WDAY + (long)ptVar3->tm_wday * 0x10 + 8);
        p[2] = *(cinatra *)(puVar2 + 1);
        *(undefined2 *)p = *puVar2;
        p[3] = c;
        p[4] = (cinatra)0x20;
LAB_00232f7a:
        p = p + 5;
      }
      else if (cVar1 == 'b') {
        puVar2 = *(undefined2 **)(YMON + (long)ptVar3->tm_mon * 0x10 + 8);
        p[2] = *(cinatra *)(puVar2 + 1);
        *(undefined2 *)p = *puVar2;
        p[3] = c;
        p = p + 4;
      }
      else {
        if (cVar1 == 'd') {
          num = ptVar3->tm_mday;
          goto LAB_00232fd3;
        }
        if (cVar1 == 'Y') {
          to_int<4ul>(ptVar3->tm_year + 0x76c,(char)c,(char *)p);
          goto LAB_00232f7a;
        }
      }
    }
LAB_00232fdf:
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

inline std::string_view get_local_time_str(char (&buf)[N], std::time_t t,
                                           std::string_view format) {
  static_assert(N >= 20, "wrong buf");
  struct tm *loc_time = gmtime(&t);

  char *p = buf;

  for (int i = 0; i < format.size(); ++i) {
    if (format[i] == '%') {
      char c = i + 2 < format.size() ? format[i + 2] : '0';
      i++;
      if (format[i] == 'Y') {
        to_year(p, loc_time->tm_year + 1900, c);
        p += 5;
      }
      else if (format[i] == 'm') {
        to_month(p, loc_time->tm_mon + 1, c);
        p += 3;
      }
      else if (format[i] == 'd') {
        to_day(p, loc_time->tm_mday, c);
        p += 3;
      }
      else if (format[i] == 'H') {
        to_hour(p, loc_time->tm_hour + Hour, c);
        p += 3;
      }
      else if (format[i] == 'M') {
        to_min(p, loc_time->tm_min, c);
        p += 3;
      }
      else if (format[i] == 'S') {
        to_sec(p, loc_time->tm_sec, c);
        p += 3;
      }
      else if (format[i] == 'a') {
        memcpy(p, WDAY[loc_time->tm_wday].data(), 3);
        p += 3;
        *p++ = c;
        *p++ = ' ';
      }
      else if (format[i] == 'b') {
        memcpy(p, YMON[loc_time->tm_mon].data(), 3);
        p += 3;
        *p = c;
        p += 1;
      }
    }
  }

  size_t n = p - buf - 1;

  return {buf, n};
}